

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrConditionalWrapper.cpp
# Opt level: O0

Statement * __thiscall
IRT::OrConditionalWrapper::ToConditional
          (OrConditionalWrapper *this,Label *true_label,Label *false_label)

{
  SubtreeWrapper *pSVar1;
  int iVar2;
  int iVar3;
  SeqStatement *this_00;
  undefined4 extraout_var;
  SeqStatement *this_01;
  LabelStatement *this_02;
  undefined4 extraout_var_00;
  Label local_f8;
  Label local_d8;
  undefined1 local_b1;
  Label local_b0;
  Label local_90;
  Label local_70;
  undefined1 local_40 [8];
  Label middle_label;
  Label *false_label_local;
  Label *true_label_local;
  OrConditionalWrapper *this_local;
  
  middle_label.label_.field_2._8_8_ = false_label;
  Label::Label((Label *)local_40);
  this_00 = (SeqStatement *)operator_new(0x18);
  pSVar1 = this->first_;
  Label::Label(&local_70,true_label);
  Label::Label(&local_90,(Label *)local_40);
  iVar2 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,&local_70,&local_90);
  this_01 = (SeqStatement *)operator_new(0x18);
  this_02 = (LabelStatement *)operator_new(0x28);
  local_b1 = 1;
  Label::Label(&local_b0,(Label *)local_40);
  LabelStatement::LabelStatement(this_02,&local_b0);
  local_b1 = 0;
  pSVar1 = this->second_;
  Label::Label(&local_d8,true_label);
  Label::Label(&local_f8,false_label);
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,&local_d8,&local_f8);
  SeqStatement::SeqStatement
            (this_01,(Statement *)this_02,(Statement *)CONCAT44(extraout_var_00,iVar3));
  SeqStatement::SeqStatement(this_00,(Statement *)CONCAT44(extraout_var,iVar2),(Statement *)this_01)
  ;
  Label::~Label(&local_f8);
  Label::~Label(&local_d8);
  Label::~Label(&local_b0);
  Label::~Label(&local_90);
  Label::~Label(&local_70);
  Label::~Label((Label *)local_40);
  return &this_00->super_Statement;
}

Assistant:

Statement *OrConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    Label middle_label;
    return new SeqStatement(
        first_->ToConditional(true_label, middle_label),
        new SeqStatement(
            new LabelStatement(middle_label),
            second_->ToConditional(true_label, false_label)
        )
    );
}